

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O2

bool __thiscall
chrono::collision::ChCollisionSystemBullet::RayHit
          (ChCollisionSystemBullet *this,ChVector<double> *from,ChVector<double> *to,
          ChCollisionModel *model,ChRayhitResult *result,short filter_group,short filter_mask)

{
  double dVar1;
  undefined1 auVar2 [32];
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  undefined2 in_register_0000008a;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  AllHitsRayResultCallback local_e0;
  
  local_e0.super_RayResultCallback.m_collisionFilterGroup =
       CONCAT22(in_register_0000008a,filter_group);
  auVar6 = vcvtpd2ps_avx(*(undefined1 (*) [16])from->m_data);
  local_e0.super_RayResultCallback.m_collisionFilterMask = (int)filter_mask;
  local_e0.m_rayFromWorld.m_floats._0_8_ = vmovlps_avx(auVar6);
  auVar6 = vcvtpd2ps_avx(*(undefined1 (*) [16])to->m_data);
  local_e0.m_rayFromWorld.m_floats._8_8_ = ZEXT48((uint)(float)from->m_data[2]);
  local_e0.super_RayResultCallback.m_closestHitFraction = 1.0;
  local_e0.super_RayResultCallback.m_collisionObject = (cbtCollisionObject *)0x0;
  local_e0.super_RayResultCallback.m_flags = 0;
  local_e0.super_RayResultCallback._vptr_RayResultCallback =
       (_func_int **)&PTR__AllHitsRayResultCallback_01188d08;
  local_e0.m_collisionObjects.m_ownsMemory = true;
  local_e0.m_collisionObjects.m_data = (cbtCollisionObject **)0x0;
  local_e0.m_collisionObjects.m_size = 0;
  local_e0.m_collisionObjects.m_capacity = 0;
  local_e0.m_rayToWorld.m_floats._0_8_ = vmovlps_avx(auVar6);
  local_e0.m_rayToWorld.m_floats._8_8_ = ZEXT48((uint)(float)to->m_data[2]);
  local_e0.m_hitNormalWorld.m_ownsMemory = true;
  local_e0.m_hitNormalWorld.m_data = (cbtVector3 *)0x0;
  local_e0.m_hitNormalWorld.m_size = 0;
  local_e0.m_hitNormalWorld.m_capacity = 0;
  local_e0.m_hitPointWorld.m_ownsMemory = true;
  local_e0.m_hitPointWorld.m_data = (cbtVector3 *)0x0;
  local_e0.m_hitPointWorld.m_size = 0;
  local_e0.m_hitPointWorld.m_capacity = 0;
  local_e0.m_hitFractions.m_ownsMemory = true;
  local_e0.m_hitFractions.m_data = (float *)0x0;
  local_e0.m_hitFractions.m_size = 0;
  local_e0.m_hitFractions.m_capacity = 0;
  (*this->bt_collision_world->_vptr_cbtCollisionWorld[8])();
  fVar11 = 1.0;
  uVar4 = 0xffffffffffffffff;
  for (uVar5 = 0;
      (uint)(~(local_e0.m_collisionObjects.m_size >> 0x1f) & local_e0.m_collisionObjects.m_size) !=
      uVar5; uVar5 = uVar5 + 1) {
    if ((ChCollisionModel *)local_e0.m_collisionObjects.m_data[uVar5]->m_userObjectPointer == model)
    {
      if (local_e0.m_hitFractions.m_data[uVar5] < fVar11) {
        uVar4 = uVar5 & 0xffffffff;
        fVar11 = local_e0.m_hitFractions.m_data[uVar5];
      }
    }
  }
  iVar3 = (int)uVar4;
  if (iVar3 == -1) {
    result->hit = false;
  }
  else {
    result->hit = true;
    auVar6 = _DAT_00f48910;
    result->hitModel =
         (ChCollisionModel *)local_e0.m_collisionObjects.m_data[iVar3]->m_userObjectPointer;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)(local_e0.m_hitPointWorld.m_data[iVar3].m_floats + 1);
    auVar6 = vpermi2ps_avx512vl(auVar6,auVar9,
                                ZEXT416((uint)local_e0.m_hitPointWorld.m_data[iVar3].m_floats[0]));
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)local_e0.m_hitNormalWorld.m_data[iVar3].m_floats[0])
                           ,0x30);
    auVar2 = vcvtps2pd_avx(auVar6);
    result->abs_hitPoint = (ChVector<double>)auVar2._0_24_;
    (result->abs_hitNormal).m_data[0] = (double)auVar2._24_8_;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)(local_e0.m_hitNormalWorld.m_data[iVar3].m_floats + 1);
    auVar6 = vcvtps2pd_avx(auVar6);
    *(undefined1 (*) [16])((result->abs_hitNormal).m_data + 1) = auVar6;
    ChVector<double>::Normalize(&result->abs_hitNormal);
    dVar7 = (double)fVar11;
    result->dist_factor = dVar7;
    (*result->hitModel->_vptr_ChCollisionModel[0x25])();
    dVar8 = (double)SUB84(dVar7,0);
    dVar7 = (result->abs_hitNormal).m_data[2];
    dVar1 = (result->abs_hitPoint).m_data[2];
    auVar10._0_8_ = dVar8 * (result->abs_hitNormal).m_data[0];
    auVar10._8_8_ = dVar8 * (result->abs_hitNormal).m_data[1];
    auVar6 = vsubpd_avx(*(undefined1 (*) [16])(result->abs_hitPoint).m_data,auVar10);
    *(undefined1 (*) [16])(result->abs_hitPoint).m_data = auVar6;
    (result->abs_hitPoint).m_data[2] = dVar1 - dVar8 * dVar7;
  }
  cbtCollisionWorld::AllHitsRayResultCallback::~AllHitsRayResultCallback(&local_e0);
  return iVar3 != -1;
}

Assistant:

bool ChCollisionSystemBullet::RayHit(const ChVector<>& from,
                                     const ChVector<>& to,
                                     ChCollisionModel* model,
                                     ChRayhitResult& result,
                                     short int filter_group,
                                     short int filter_mask) const {
    cbtVector3 btfrom((cbtScalar)from.x(), (cbtScalar)from.y(), (cbtScalar)from.z());
    cbtVector3 btto((cbtScalar)to.x(), (cbtScalar)to.y(), (cbtScalar)to.z());

    cbtCollisionWorld::AllHitsRayResultCallback rayCallback(btfrom, btto);
    rayCallback.m_collisionFilterGroup = filter_group;
    rayCallback.m_collisionFilterMask = filter_mask;

    this->bt_collision_world->rayTest(btfrom, btto, rayCallback);

    // Find the closest hit result on the specified model (if any)
    int hit = -1;
    cbtScalar fraction = 1;
    for (int i = 0; i < rayCallback.m_collisionObjects.size(); ++i) {
        if (rayCallback.m_collisionObjects[i]->getUserPointer() == model && rayCallback.m_hitFractions[i] < fraction) {
            hit = i;
            fraction = rayCallback.m_hitFractions[i];
        }
    }

    // Ray does not hit specified model
    if (hit == -1) {
        result.hit = false;
        return false;
    }

    // Return the closest hit on the specified model
    result.hit = true;
    result.hitModel = static_cast<ChCollisionModel*>(rayCallback.m_collisionObjects[hit]->getUserPointer());
    result.abs_hitPoint.Set(rayCallback.m_hitPointWorld[hit].x(), rayCallback.m_hitPointWorld[hit].y(),
                            rayCallback.m_hitPointWorld[hit].z());
    result.abs_hitNormal.Set(rayCallback.m_hitNormalWorld[hit].x(), rayCallback.m_hitNormalWorld[hit].y(),
                             rayCallback.m_hitNormalWorld[hit].z());
    result.abs_hitNormal.Normalize();
    result.dist_factor = fraction;
    result.abs_hitPoint = result.abs_hitPoint - result.abs_hitNormal * result.hitModel->GetEnvelope();
    return true;
}